

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl::AddJarManifest
          (GeneratorContextImpl *this)

{
  mapped_type *ppbVar1;
  mapped_type this_00;
  allocator local_4d [20];
  allocator local_39;
  key_type local_38;
  mapped_type *local_18;
  string **map_slot;
  GeneratorContextImpl *this_local;
  
  map_slot = (string **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"META-INF/MANIFEST.MF",&local_39);
  ppbVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
            ::operator[](&this->files_,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (*ppbVar1 == (mapped_type)0x0) {
    local_18 = ppbVar1;
    this_00 = (mapped_type)operator_new(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)this_00,"Manifest-Version: 1.0\nCreated-By: 1.6.0 (protoc)\n\n",local_4d);
    *local_18 = this_00;
    std::allocator<char>::~allocator((allocator<char> *)local_4d);
  }
  return;
}

Assistant:

void CommandLineInterface::GeneratorContextImpl::AddJarManifest() {
  string** map_slot = &files_["META-INF/MANIFEST.MF"];
  if (*map_slot == NULL) {
    *map_slot = new string(
        "Manifest-Version: 1.0\n"
        "Created-By: 1.6.0 (protoc)\n"
        "\n");
  }
}